

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O2

void __thiscall ELFIO::elfio::create(elfio *this,uchar file_class,uchar encoding)

{
  elf_header *peVar1;
  Sections SVar2;
  elfio *in_RAX;
  undefined7 in_register_00000011;
  Sections local_28;
  
  local_28.parent = in_RAX;
  std::
  vector<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
  ::clear(&this->sections_);
  std::
  vector<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
  ::clear(&this->segments_);
  (this->convertor).need_conversion = (int)CONCAT71(in_register_00000011,encoding) != 1;
  create_header((elfio *)&stack0xffffffffffffffd8,(uchar)this,file_class);
  SVar2.parent = local_28.parent;
  local_28.parent = (elfio *)0x0;
  peVar1 = (this->header)._M_t.
           super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t.
           super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
           super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl;
  (this->header)._M_t.
  super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t.
  super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
  super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl = (elf_header *)SVar2.parent;
  if (peVar1 != (elf_header *)0x0) {
    (*peVar1->_vptr_elf_header[1])();
    if (local_28.parent != (elfio *)0x0) {
      (*(code *)((((local_28.parent)->sections).parent)->segments).parent)();
    }
  }
  create_mandatory_sections(this);
  return;
}

Assistant:

void create( unsigned char file_class, unsigned char encoding )
    {
        sections_.clear();
        segments_.clear();
        convertor.setup( encoding );
        header = create_header( file_class, encoding );
        create_mandatory_sections();
    }